

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O3

void * cnn::cnn_mm_malloc(size_t n,size_t align)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this;
  size_t __alignment;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (align == 1) {
    local_40[0] = (undefined1 *)malloc(n);
  }
  else {
    __alignment = 8;
    if (8 < align) {
      __alignment = align;
    }
    if ((align - 1 & align) != 0) {
      __alignment = align;
    }
    iVar1 = posix_memalign(local_40,__alignment,n);
    if (iVar1 != 0) goto LAB_0016a8d7;
  }
  if (local_40[0] != (undefined1 *)0x0) {
    return local_40[0];
  }
LAB_0016a8d7:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Memory allocation failed n=",0x1b);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," align=",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Memory allocation failed in cnn_mm_malloc()","");
  std::runtime_error::runtime_error(this,(string *)local_40);
  *(undefined ***)this = &PTR__runtime_error_002a0268;
  __cxa_throw(this,&out_of_memory::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void* cnn_mm_malloc(size_t n, size_t align) {
  void* ptr = nullptr;
#if HAVE_CUDA
  CUDA_CHECK(cudaMalloc(&ptr, n));
#else
  ptr = _mm_malloc(n, align);
#endif
  if (!ptr) {
    std::cerr << "Memory allocation failed n=" << n << " align=" << align << std::endl;
    throw cnn::out_of_memory("Memory allocation failed in cnn_mm_malloc()");
  }
  return ptr;
}